

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_file.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::part_file::export_file
          (part_file *this,function<void_(long,_libtorrent::span<char>)> *f,int64_t offset,
          int64_t size,error_code *ec)

{
  const_iterator __it;
  iterator __position;
  int iVar1;
  __node_base_ptr p_Var2;
  void *pvVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  error_code *in_R9;
  long lVar7;
  __pthread_internal_list *p_Var8;
  span<char> buf;
  file_handle file;
  piece_index_t piece;
  unique_lock<std::mutex> l;
  undefined1 local_90 [4];
  key_type local_8c;
  void *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  _Alloc_hider local_70;
  undefined1 local_68 [32];
  long local_48;
  span<char> local_40;
  
  local_68._0_8_ = &this->m_mutex;
  local_68[8] = false;
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_68);
  local_68[8] = true;
  if ((this->m_piece_map)._M_h._M_element_count != 0) {
    lVar7 = (long)this->m_piece_size;
    iVar4 = (int)(offset / lVar7);
    local_70._M_p = (pointer)((offset + size + lVar7 + -1) / lVar7);
    local_8c.m_val = iVar4;
    local_68._24_8_ = f;
    open_file((part_file *)local_90,(open_mode_t)(uint)this,(error_code *)0x0);
    if ((ec->failed_ == false) && (local_8c.m_val < (int)local_70._M_p)) {
      local_80._M_allocated_capacity = (size_type)&this->m_piece_map;
      lVar7 = offset - iVar4 * lVar7;
      local_68._16_8_ = &this->m_free_slots;
      lVar6 = 0;
      pvVar3 = (void *)0x0;
      local_80._8_8_ = ec;
      do {
        p_Var2 = ::std::
                 _Hashtable<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>,_std::__detail::_Select1st,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::_M_find_before_node
                           ((_Hashtable<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>,_std::__detail::_Select1st,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)local_80._M_allocated_capacity,
                            (ulong)(long)local_8c.m_val % (this->m_piece_map)._M_h._M_bucket_count,
                            &local_8c,(long)local_8c.m_val);
        if (p_Var2 == (__node_base_ptr)0x0) {
          lVar7 = this->m_piece_size - lVar7;
          if (size < lVar7) {
            lVar7 = size;
          }
          iVar4 = (int)lVar7;
        }
        else {
          lVar5 = this->m_piece_size - lVar7;
          if (size < lVar5) {
            lVar5 = size;
          }
          iVar4 = (int)lVar5;
          if (p_Var2->_M_nxt != (_Hash_node_base *)0x0) {
            local_88 = (void *)(long)*(int *)((long)&p_Var2->_M_nxt[1]._M_nxt + 4);
            if (pvVar3 == (void *)0x0) {
              pvVar3 = operator_new__((long)this->m_piece_size);
            }
            ::std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_68);
            p_Var8 = (__pthread_internal_list *)(long)iVar4;
            buf.m_len = lVar7 + this->m_header_size + (long)this->m_piece_size * (long)local_88;
            buf.m_ptr = (char *)p_Var8;
            local_88 = pvVar3;
            iVar1 = pread_all((aux *)(ulong)(uint)local_90,(handle_type)pvVar3,buf,local_80._8_8_,
                              in_R9);
            if ((iVar1 == 0) || (*(bool *)(local_80._8_8_ + 4) != false)) {
              file_handle::~file_handle((file_handle *)local_90);
              pvVar3 = local_88;
              goto LAB_0023792e;
            }
            local_40.m_ptr = (char *)local_88;
            local_48 = lVar6;
            local_40.m_len = (difference_type)p_Var8;
            if (*(long *)(local_68._24_8_ + 0x10) == 0) {
              ::std::__throw_bad_function_call();
            }
            (**(code **)(local_68._24_8_ + 0x18))((_Any_data *)local_68._24_8_,&local_48,&local_40);
            ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_68);
            pvVar3 = local_88;
            if (((this->m_piece_size == iVar4) &&
                (p_Var2 = ::std::
                          _Hashtable<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>,_std::__detail::_Select1st,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          ::_M_find_before_node
                                    ((_Hashtable<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>,_std::__detail::_Select1st,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                      *)local_80._M_allocated_capacity,
                                     (ulong)(long)local_8c.m_val %
                                     (this->m_piece_map)._M_h._M_bucket_count,&local_8c,
                                     (long)local_8c.m_val), p_Var2 != (__node_base_ptr)0x0)) &&
               (__it.
                super__Node_iterator_base<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_true>
                ._M_cur = (_Node_iterator_base<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_true>
                           )p_Var2->_M_nxt,
               __it.
               super__Node_iterator_base<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_true>
               ._M_cur != (__node_type *)0x0)) {
              __position._M_current =
                   (this->m_free_slots).
                   super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (this->m_free_slots).
                  super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                ::std::
                vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::slot_index_tag_t,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::slot_index_tag_t,void>>>
                ::
                _M_realloc_insert<libtorrent::aux::strong_typedef<int,libtorrent::aux::slot_index_tag_t,void>const&>
                          ((vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::slot_index_tag_t,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::slot_index_tag_t,void>>>
                            *)local_68._16_8_,__position,
                           (strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void> *)
                           ((long)__it.
                                  super__Node_iterator_base<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_true>
                                  ._M_cur + 0xc));
              }
              else {
                (__position._M_current)->m_val =
                     ((strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void> *)
                     ((long)__it.
                            super__Node_iterator_base<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_true>
                            ._M_cur + 0xc))->m_val;
                (this->m_free_slots).
                super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
              }
              ::std::
              _Hashtable<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>,_std::__detail::_Select1st,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::erase((_Hashtable<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>,_std::__detail::_Select1st,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)local_80._M_allocated_capacity,__it);
              this->m_dirty_metadata = true;
            }
          }
        }
        lVar6 = lVar6 + iVar4;
        size = size - iVar4;
        local_8c.m_val = local_8c.m_val + 1;
        lVar7 = 0;
      } while (local_8c.m_val < (int)local_70._M_p);
      file_handle::~file_handle((file_handle *)local_90);
      if (pvVar3 != (void *)0x0) {
LAB_0023792e:
        operator_delete__(pvVar3);
      }
    }
    else {
      file_handle::~file_handle((file_handle *)local_90);
    }
  }
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_68);
  return;
}

Assistant:

void part_file::export_file(std::function<void(std::int64_t, span<char>)> f
		, std::int64_t const offset, std::int64_t size, error_code& ec)
	{
		std::unique_lock<std::mutex> l(m_mutex);

		// there's nothing stored in the part_file. Nothing to do
		if (m_piece_map.empty()) return;

		piece_index_t piece(int(offset / m_piece_size));
		piece_index_t const end = piece_index_t(int(((offset + size) + m_piece_size - 1) / m_piece_size));

		std::unique_ptr<char[]> buf;

		std::int64_t piece_offset = offset - std::int64_t(static_cast<int>(piece))
			* m_piece_size;
		std::int64_t file_offset = 0;
		auto file = open_file(aux::open_mode::read_only, ec);
		if (ec) return;

		for (; piece < end; ++piece)
		{
			auto const i = m_piece_map.find(piece);
			int const block_to_copy = int(std::min(m_piece_size - piece_offset, size));
			if (i != m_piece_map.end())
			{
				slot_index_t const slot = i->second;

				if (!buf) buf.reset(new char[std::size_t(m_piece_size)]);

				// don't hold the lock during disk I/O
				l.unlock();

				span<char> v = {buf.get(), block_to_copy};
				auto bytes_read = aux::pread_all(file.fd(), v, slot_offset(slot) + piece_offset, ec);
				v = v.first(static_cast<std::ptrdiff_t>(bytes_read));
				TORRENT_ASSERT(!ec);
				if (ec || v.empty()) return;

				f(file_offset, {buf.get(), block_to_copy});

				// we're done with the disk I/O, grab the lock again to update
				// the slot map
				l.lock();

				if (block_to_copy == m_piece_size)
				{
					// since we released the lock, it's technically possible that
					// another thread removed this slot map entry, and invalidated
					// our iterator. Now that we hold the lock again, perform
					// another lookup to be sure.
					auto const j = m_piece_map.find(piece);
					if (j != m_piece_map.end())
					{
						// if the slot moved, that's really suspicious
						TORRENT_ASSERT(j->second == slot);
						m_free_slots.push_back(j->second);
						m_piece_map.erase(j);
						m_dirty_metadata = true;
					}
				}
			}
			file_offset += block_to_copy;
			piece_offset = 0;
			size -= block_to_copy;
		}
	}